

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# columnref_expression.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnRefExpression::ColumnRefExpression
          (ColumnRefExpression *this,string *column_name,string *table_name)

{
  size_type sVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [32];
  
  sVar1 = table_name->_M_string_length;
  if (sVar1 == 0) {
    ::std::__cxx11::string::string((string *)&local_60,(string *)column_name);
    __l_00._M_len = 1;
    __l_00._M_array = &local_60;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_78,__l_00,&local_79);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_60,(string *)table_name);
    ::std::__cxx11::string::string(local_40,(string *)column_name);
    __l._M_len = 2;
    __l._M_array = &local_60;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_78,__l,&local_79);
  }
  ColumnRefExpression(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)local_78);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_78);
  if (sVar1 == 0) {
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    lVar2 = 0x20;
    do {
      ::std::__cxx11::string::~string((string *)((long)&local_60._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
  }
  return;
}

Assistant:

ColumnRefExpression::ColumnRefExpression(string column_name, string table_name)
    : ColumnRefExpression(table_name.empty() ? vector<string> {std::move(column_name)}
                                             : vector<string> {std::move(table_name), std::move(column_name)}) {
}